

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Lib::List<Kernel::Formula_*>_*>::~Stack(Stack<Lib::List<Kernel::Formula_*>_*> *this)

{
  List<Kernel::Formula_*> **ppLVar1;
  ulong uVar2;
  
  ppLVar1 = this->_stack;
  if (ppLVar1 != (List<Kernel::Formula_*> **)0x0) {
    uVar2 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *ppLVar1 = (List<Kernel::Formula_*> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppLVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *ppLVar1 = (List<Kernel::Formula_*> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppLVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *ppLVar1 = (List<Kernel::Formula_*> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppLVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *ppLVar1 = (List<Kernel::Formula_*> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppLVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *ppLVar1 = (List<Kernel::Formula_*> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppLVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(ppLVar1,0x10);
      return;
    }
    *ppLVar1 = (List<Kernel::Formula_*> *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppLVar1;
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }